

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleter::setPopup(QCompleter *this,QAbstractItemView *popup)

{
  bool bVar1;
  QCompleterPrivate *pQVar2;
  QWidget *this_00;
  QItemSelectionModel *pQVar3;
  QCompletionModel *pQVar4;
  QListView *pQVar5;
  QAbstractItemView *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QListView *listView;
  FocusPolicy origPolicy;
  QCompleterPrivate *d;
  undefined8 in_stack_ffffffffffffff88;
  FocusPolicy policy;
  QAbstractItemView *view;
  QWidget *in_stack_ffffffffffffff90;
  QCompleterItemDelegate *this_01;
  QAbstractItemView *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  FocusPolicy flag;
  Connection in_stack_ffffffffffffffe0;
  Connection in_stack_ffffffffffffffe8;
  Connection local_10;
  long local_8;
  
  policy = (FocusPolicy)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QCompleter *)0xa6e43f);
  if (in_RSI != pQVar2->popup) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6e46a);
    if (bVar1) {
      this_00 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6e47e);
      flag = QWidget::focusPolicy(this_00);
    }
    else {
      flag = NoFocus;
    }
    if (pQVar2->popup != (QAbstractItemView *)0x0) {
      pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff90);
      QObject::disconnect((QObject *)pQVar3,(char *)0x0,&in_RDI->super_QObject,(char *)0x0);
      QObject::disconnect((QObject *)pQVar2->popup,(char *)0x0,&in_RDI->super_QObject,(char *)0x0);
      in_stack_ffffffffffffffa0 = pQVar2->popup;
      if (in_stack_ffffffffffffffa0 != (QAbstractItemView *)0x0) {
        (**(code **)(*(long *)&(in_stack_ffffffffffffffa0->super_QAbstractScrollArea).super_QFrame.
                               super_QWidget + 0x20))();
      }
    }
    pQVar2->popup = in_RSI;
    pQVar4 = (QCompletionModel *)QAbstractItemView::model(in_stack_ffffffffffffffa0);
    if (pQVar4 != pQVar2->proxy) {
      (**(code **)(*(long *)&(pQVar2->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                  0x1c8))(pQVar2->popup,pQVar2->proxy);
    }
    QWidget::hide((QWidget *)0xa6e573);
    QWidget::setParent(in_RDI,(QWidget *)CONCAT44(flag,in_stack_ffffffffffffffa8));
    QWidget::setWindowFlag(in_RDI,flag,SUB41((uint)in_stack_ffffffffffffffa8 >> 0x18,0));
    QWidget::setFocusPolicy(in_stack_ffffffffffffff90,policy);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa6e5c4);
    if (bVar1) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0xa6e5d8);
      QWidget::setFocusPolicy(in_stack_ffffffffffffff90,policy);
    }
    view = pQVar2->popup;
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0xa6e602);
    QWidget::setFocusProxy
              ((QWidget *)in_stack_ffffffffffffffe8.d_ptr,(QWidget *)in_stack_ffffffffffffffe0.d_ptr
              );
    QObject::installEventFilter((QObject *)pQVar2->popup);
    this_01 = (QCompleterItemDelegate *)pQVar2->popup;
    operator_new(0x18);
    QCompleterItemDelegate::QCompleterItemDelegate(this_01,view);
    QAbstractItemView::setItemDelegate
              (in_stack_ffffffffffffffa0,
               (QAbstractItemDelegate *)CONCAT44(flag,in_stack_ffffffffffffffa8));
    pQVar5 = qobject_cast<QListView*>((QObject *)0xa6e678);
    if (pQVar5 != (QListView *)0x0) {
      QListView::setModelColumn((QListView *)in_RDI,flag);
    }
    QObject::connect((QObject *)&local_10,(char *)pQVar2->popup,(QObject *)"2clicked(QModelIndex)",
                     (char *)in_RDI,0xb4b5f5);
    QMetaObject::Connection::~Connection(&local_10);
    QObject::connect((QObject *)&stack0xffffffffffffffe8,(char *)in_RDI,
                     (QObject *)"2activated(QModelIndex)",(char *)pQVar2->popup,0xb4b627);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffe8);
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this_01);
    QObject::connect((QObject *)&stack0xffffffffffffffe0,(char *)pQVar3,
                     (QObject *)"2selectionChanged(QItemSelection,QItemSelection)",(char *)in_RDI,
                     0xb4b660);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffe0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::setPopup(QAbstractItemView *popup)
{
    Q_ASSERT(popup);
    Q_D(QCompleter);
    if (popup == d->popup)
        return;

    // Remember existing widget's focus policy, default to NoFocus
    const Qt::FocusPolicy origPolicy = d->widget ? d->widget->focusPolicy()
                                                 : Qt::NoFocus;

    // If popup existed already, disconnect signals and delete object
    if (d->popup) {
        QObject::disconnect(d->popup->selectionModel(), nullptr, this, nullptr);
        QObject::disconnect(d->popup, nullptr, this, nullptr);
        delete d->popup;
    }

    // Assign new object, set model and hide
    d->popup = popup;
    if (d->popup->model() != d->proxy)
        d->popup->setModel(d->proxy);
    d->popup->hide();

    // Mark the widget window as a popup, so that if the last non-popup window is closed by the
    // user, the application should not be prevented from exiting. It needs to be set explicitly via
    // setWindowFlag(), because passing the flag via setParent(parent, windowFlags) does not call
    // QWidgetPrivate::adjustQuitOnCloseAttribute(), and causes an application not to exit if the
    // popup ends up being the last window.
    d->popup->setParent(nullptr);
    d->popup->setWindowFlag(Qt::Popup);
    d->popup->setFocusPolicy(Qt::NoFocus);
    if (d->widget)
        d->widget->setFocusPolicy(origPolicy);

    d->popup->setFocusProxy(d->widget);
    d->popup->installEventFilter(this);
    d->popup->setItemDelegate(new QCompleterItemDelegate(d->popup));
#if QT_CONFIG(listview)
    if (QListView *listView = qobject_cast<QListView *>(d->popup)) {
        listView->setModelColumn(d->column);
    }
#endif

    QObject::connect(d->popup, SIGNAL(clicked(QModelIndex)),
                     this, SLOT(_q_complete(QModelIndex)));
    QObject::connect(this, SIGNAL(activated(QModelIndex)),
                     d->popup, SLOT(hide()));

    QObject::connect(d->popup->selectionModel(), SIGNAL(selectionChanged(QItemSelection,QItemSelection)),
                     this, SLOT(_q_completionSelected(QItemSelection)));
}